

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCheck.c
# Opt level: O2

int Ivy_ManCheckFanoutNums(Ivy_Man_t *p)

{
  void *pvVar1;
  uint uVar2;
  int i;
  
  uVar2 = 0;
  for (i = 0; i < p->vObjs->nSize; i = i + 1) {
    pvVar1 = Vec_PtrEntry(p->vObjs,i);
    if ((pvVar1 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar1 + 8) & 0xf) - 7)) {
      uVar2 = uVar2 + (*(int *)((long)pvVar1 + 0xc) == 0);
    }
  }
  if (uVar2 != 0) {
    printf("Sequential AIG has %d dangling nodes.\n",(ulong)uVar2);
  }
  return uVar2;
}

Assistant:

int Ivy_ManCheckFanoutNums( Ivy_Man_t * p )
{
    Ivy_Obj_t * pObj;
    int i, Counter = 0;
    Ivy_ManForEachObj( p, pObj, i )
        if ( Ivy_ObjIsNode(pObj) )
            Counter += (Ivy_ObjRefs(pObj) == 0);
    if ( Counter )
        printf( "Sequential AIG has %d dangling nodes.\n", Counter );
    return Counter;
}